

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCore.c
# Opt level: O3

void Ssw_ManUpdateEquivs(Ssw_Man_t *p,Aig_Man_t *pAig,int fVerbose)

{
  int iVar1;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  int iVar4;
  int iVar5;
  Vec_Ptr_t *__ptr;
  long lVar6;
  Vec_Ptr_t *pVVar7;
  uint uVar8;
  int iVar9;
  
  __ptr = Aig_ManDfsNodes(pAig,(Aig_Obj_t **)
                               (pAig->vCos->pArray + ((long)pAig->nTruePos - (long)pAig->nConstrs)),
                          pAig->nConstrs);
  pVVar7 = pAig->vObjs;
  if (pVVar7->nSize < 1) {
    iVar9 = 0;
    iVar5 = 0;
  }
  else {
    lVar6 = 0;
    iVar5 = 0;
    iVar9 = 0;
    do {
      pvVar2 = pVVar7->pArray[lVar6];
      iVar4 = iVar9;
      if ((pvVar2 != (void *)0x0) &&
         ((uVar8 = (uint)*(undefined8 *)((long)pvVar2 + 0x18), (uVar8 & 7) == 2 ||
          (0xfffffffd < (uVar8 & 7) - 7)))) {
        pAVar3 = pAig->pReprs[lVar6];
        iVar1 = iVar9 + 1;
        iVar4 = iVar1;
        if (pAVar3 == (Aig_Obj_t *)0x0) {
          iVar4 = iVar9;
        }
        if ((((*(int *)((long)pvVar2 + 0x20) == pAig->nTravIds) &&
             (iVar4 = iVar9, pAVar3 != (Aig_Obj_t *)0x0)) &&
            (iVar4 = iVar1, p->pPars->fConstrs != 0)) && (p->pPars->fMergeFull == 0)) {
          pAig->pReprs[lVar6] = (Aig_Obj_t *)0x0;
          iVar5 = iVar5 + 1;
          pVVar7 = pAig->vObjs;
        }
      }
      iVar9 = iVar4;
      lVar6 = lVar6 + 1;
    } while (lVar6 < pVVar7->nSize);
  }
  p->nConesTotal = pAig->nObjs[5] + pAig->nObjs[2] + pAig->nObjs[6];
  p->nConesConstr = __ptr->nSize;
  p->nEquivsTotal = iVar9;
  p->nEquivsConstr = iVar5;
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  return;
}

Assistant:

void Ssw_ManUpdateEquivs( Ssw_Man_t * p, Aig_Man_t * pAig, int fVerbose )
{
    Vec_Ptr_t * vCones;
    Aig_Obj_t ** pArray;
    Aig_Obj_t * pObj;
    int i, nTotal = 0, nRemoved = 0;
    // collect the nodes in the cone of constraints
    pArray  = (Aig_Obj_t **)Vec_PtrArray(pAig->vCos);
    pArray += Saig_ManPoNum(pAig) - Saig_ManConstrNum(pAig);
    vCones  = Aig_ManDfsNodes( pAig, pArray, Saig_ManConstrNum(pAig) );
    // remove all the node that are equiv to something and are in the cones
    Aig_ManForEachObj( pAig, pObj, i )
    {
        if ( !Aig_ObjIsCi(pObj) && !Aig_ObjIsNode(pObj) )
            continue;
        if ( pAig->pReprs[i] != NULL )
            nTotal++;
        if ( !Aig_ObjIsTravIdCurrent(pAig, pObj) )
            continue;
        if ( pAig->pReprs[i] )
        {
            if ( p->pPars->fConstrs && !p->pPars->fMergeFull )
            {
                pAig->pReprs[i] = NULL;
                nRemoved++;
            }
        }
    }
    // collect statistics    
    p->nConesTotal   = Aig_ManCiNum(pAig) + Aig_ManNodeNum(pAig);
    p->nConesConstr  = Vec_PtrSize(vCones);
    p->nEquivsTotal  = nTotal;
    p->nEquivsConstr = nRemoved;
    Vec_PtrFree( vCones );
}